

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

gfield * __thiscall gfield::sub<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  bool bVar1;
  undefined1 local_40 [8];
  gfint tmp;
  bigint<13> *y_local;
  bigint<13> *x_local;
  gfield *this_local;
  
  tmp._24_8_ = y;
  bVar1 = bigint<13>::operator<(x,y);
  if (bVar1) {
    bigint<13>::bigint((bigint<13> *)local_40);
    bigint<13>::add<13,13>((bigint<13> *)local_40,x,&P.super_gfint);
    bigint<13>::sub<13,13>(&this->super_gfint,(bigint<13> *)local_40,(bigint<13> *)tmp._24_8_);
  }
  else {
    bigint<13>::sub<13,13>(&this->super_gfint,x,(bigint<13> *)tmp._24_8_);
  }
  return this;
}

Assistant:

gfield &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(x < y)
        {
            gfint tmp; /* necessary if this==&y, using this instead would clobber y */
            tmp.add(x, P);
            gfint::sub(tmp, y);
        }
        else gfint::sub(x, y);
        return *this;
    }